

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_write_key(mbedtls_rsa_context *rsa,uchar *start,uchar **p)

{
  int iVar1;
  mbedtls_mpi *in_RDX;
  mbedtls_rsa_context *in_RSI;
  mbedtls_mpi T;
  int ret;
  size_t len;
  uchar *in_stack_ffffffffffffffb8;
  mbedtls_mpi *in_stack_ffffffffffffffc0;
  mbedtls_mpi *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  mbedtls_rsa_context *ctx;
  size_t len_00;
  int local_4;
  
  ctx = (mbedtls_rsa_context *)0x0;
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffc0);
  local_4 = mbedtls_rsa_export_crt
                      (ctx,(mbedtls_mpi *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if ((local_4 == 0) &&
     (local_4 = mbedtls_asn1_write_mpi
                          ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffc8), -1 < local_4)) {
    ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
    local_4 = mbedtls_rsa_export_crt
                        (ctx,(mbedtls_mpi *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if ((local_4 == 0) &&
       (local_4 = mbedtls_asn1_write_mpi
                            ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffc8), -1 < local_4)) {
      ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
      local_4 = mbedtls_rsa_export_crt
                          (ctx,(mbedtls_mpi *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      if ((local_4 == 0) &&
         (local_4 = mbedtls_asn1_write_mpi
                              ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8), -1 < local_4)) {
        ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
        local_4 = mbedtls_rsa_export(in_RSI,in_RDX,(mbedtls_mpi *)ctx,
                                     (mbedtls_mpi *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        if ((local_4 == 0) &&
           (local_4 = mbedtls_asn1_write_mpi
                                ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                                 in_stack_ffffffffffffffc8), -1 < local_4)) {
          ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
          local_4 = mbedtls_rsa_export(in_RSI,in_RDX,(mbedtls_mpi *)ctx,
                                       (mbedtls_mpi *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
          if ((local_4 == 0) &&
             (local_4 = mbedtls_asn1_write_mpi
                                  ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffc8), -1 < local_4)) {
            ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
            local_4 = mbedtls_rsa_export(in_RSI,in_RDX,(mbedtls_mpi *)ctx,
                                         (mbedtls_mpi *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
            if ((local_4 == 0) &&
               (local_4 = mbedtls_asn1_write_mpi
                                    ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                                     in_stack_ffffffffffffffc8), -1 < local_4)) {
              ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
              local_4 = mbedtls_rsa_export(in_RSI,in_RDX,(mbedtls_mpi *)ctx,
                                           (mbedtls_mpi *)
                                           CONCAT44(local_4,in_stack_ffffffffffffffd0),
                                           in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
              if ((local_4 == 0) &&
                 (local_4 = mbedtls_asn1_write_mpi
                                      ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                                       in_stack_ffffffffffffffc8), -1 < local_4)) {
                ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
                local_4 = mbedtls_rsa_export(in_RSI,in_RDX,(mbedtls_mpi *)ctx,
                                             (mbedtls_mpi *)
                                             CONCAT44(local_4,in_stack_ffffffffffffffd0),
                                             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
                if ((local_4 == 0) &&
                   (local_4 = mbedtls_asn1_write_mpi
                                        ((uchar **)ctx,(uchar *)(ulong)in_stack_ffffffffffffffd0,
                                         in_stack_ffffffffffffffc8), -1 < local_4)) {
                  ctx = (mbedtls_rsa_context *)((long)&ctx->ver + (long)local_4);
                }
              }
            }
          }
        }
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)0x8817ed);
  if ((-1 < local_4) &&
     (local_4 = mbedtls_asn1_write_int
                          ((uchar **)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0),
     -1 < local_4)) {
    len_00 = (long)&ctx->ver + (long)local_4;
    local_4 = mbedtls_asn1_write_len((uchar **)in_RDX,(uchar *)in_RSI,len_00);
    if (-1 < local_4) {
      iVar1 = local_4 + (int)len_00;
      local_4 = mbedtls_asn1_write_tag((uchar **)in_RDX,(uchar *)in_RSI,'0');
      if (-1 < local_4) {
        local_4 = local_4 + iVar1;
      }
    }
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_write_key(const mbedtls_rsa_context *rsa, unsigned char *start,
                          unsigned char **p)
{
    size_t len = 0;
    int ret;

    mbedtls_mpi T; /* Temporary holding the exported parameters */

    /*
     * Export the parameters one after another to avoid simultaneous copies.
     */

    mbedtls_mpi_init(&T);

    /* Export QP */
    if ((ret = mbedtls_rsa_export_crt(rsa, NULL, NULL, &T)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export DQ */
    if ((ret = mbedtls_rsa_export_crt(rsa, NULL, &T, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export DP */
    if ((ret = mbedtls_rsa_export_crt(rsa, &T, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export Q */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, &T, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export P */
    if ((ret = mbedtls_rsa_export(rsa, NULL, &T, NULL, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export D */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, NULL, &T, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export E */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, NULL, NULL, &T)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export N */
    if ((ret = mbedtls_rsa_export(rsa, &T, NULL, NULL, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

end_of_export:

    mbedtls_mpi_free(&T);
    if (ret < 0) {
        return ret;
    }

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_int(p, start, 0));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_len(p, start, len));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_tag(p, start,
                                                     MBEDTLS_ASN1_CONSTRUCTED |
                                                     MBEDTLS_ASN1_SEQUENCE));

    return (int) len;
}